

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O2

QAction * __thiscall
QtMWidgets::ToolBar::addAction(ToolBar *this,QIcon *icon,QObject *receiver,char *member)

{
  QAction *this_00;
  QArrayDataPointer<char16_t> local_48;
  QObject local_30 [8];
  
  this_00 = (QAction *)operator_new(0x10);
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x0;
  local_48.size = 0;
  QAction::QAction(this_00,icon,(QString *)&local_48,(QObject *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QObject::connect(local_30,(char *)this_00,(QObject *)"2triggered(bool)",(char *)receiver,
                   (ConnectionType)member);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  QWidget::addAction((QAction *)this);
  return this_00;
}

Assistant:

QAction *
ToolBar::addAction( const QIcon & icon,
	const QObject * receiver, const char * member )
{
	QAction * action = new QAction( icon, QString(), this );
	QObject::connect( action, SIGNAL( triggered(bool) ), receiver, member );
	addAction( action );
	return action;
}